

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v7::detail::snprintf_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  buffer<char> *pbVar1;
  char cVar2;
  bool bVar3;
  int value_00;
  type tVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  undefined1 *puVar10;
  char *pcVar11;
  int local_d0;
  undefined1 local_c8;
  undefined1 local_c7;
  undefined1 local_c5;
  int local_c4;
  char *local_b8;
  char *fraction_end;
  char *pcStack_a8;
  int fraction_size;
  char *p;
  int exp;
  char sign;
  char *exp_pos;
  char *end;
  char *pcStack_80;
  int fraction_size_1;
  char *p_1;
  char *end_1;
  type local_68;
  int iStack_64;
  anon_class_1_0_00000001 is_digit;
  type size;
  int result;
  _func_int_char_ptr_size_t_char_ptr_varargs *snprintf_ptr;
  size_t capacity;
  char *begin;
  size_t offset;
  char *format_ptr;
  buffer<char> *pbStack_30;
  char format [7];
  buffer<char> *buf_local;
  int precision_local;
  double value_local;
  uint uStack_10;
  float_specs specs_local;
  
  pbStack_30 = buf;
  sVar5 = buffer<char>::capacity(buf);
  sVar6 = buffer<char>::size(pbStack_30);
  if (sVar5 <= sVar6) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                ,0x47e,"empty buffer");
  }
  uStack_10 = specs._4_4_;
  cVar2 = specs._4_1_;
  if ((cVar2 == '\0') || (buf_local._4_4_ = precision, cVar2 == '\x01')) {
    local_c4 = precision;
    if (precision < 0) {
      local_c4 = 6;
    }
    buf_local._4_4_ = local_c4 - 1;
  }
  offset = (long)&format_ptr + 2;
  format_ptr._1_1_ = 0x25;
  if (((uStack_10 >> 0x14 & 1) != 0) && (cVar2 == '\x03')) {
    offset = (long)&format_ptr + 3;
    format_ptr._2_1_ = 0x23;
  }
  if (-1 < (int)buf_local._4_4_) {
    puVar10 = (undefined1 *)(offset + 1);
    *(undefined1 *)offset = 0x2e;
    offset = offset + 2;
    *puVar10 = 0x2a;
  }
  if (cVar2 == '\x03') {
    local_c8 = 0x41;
    if (((ulong)specs & 0x1000000000000) == 0) {
      local_c8 = 0x61;
    }
    local_c7 = local_c8;
  }
  else {
    local_c5 = 0x66;
    if (cVar2 != '\x02') {
      local_c5 = 0x65;
    }
    local_c7 = local_c5;
  }
  *(undefined1 *)offset = local_c7;
  *(undefined1 *)(offset + 1) = 0;
  sVar5 = buffer<char>::size(pbStack_30);
  while( true ) {
    while( true ) {
      pcVar7 = buffer<char>::data(pbStack_30);
      pcVar7 = pcVar7 + sVar5;
      sVar6 = buffer<char>::capacity(pbStack_30);
      uVar8 = sVar6 - sVar5;
      if ((int)buf_local._4_4_ < 0) {
        local_d0 = snprintf(pcVar7,uVar8,(char *)((long)&format_ptr + 1),value,snprintf);
      }
      else {
        local_d0 = snprintf(pcVar7,uVar8,(char *)((long)&format_ptr + 1),value,
                            (ulong)buf_local._4_4_,snprintf);
      }
      pbVar1 = pbStack_30;
      iStack_64 = local_d0;
      if (-1 < local_d0) break;
      sVar6 = buffer<char>::capacity(pbStack_30);
      buffer<char>::try_reserve(pbVar1,sVar6 + 1);
    }
    local_68 = to_unsigned<int>(local_d0);
    if (local_68 < uVar8) break;
    buffer<char>::try_reserve(pbStack_30,local_68 + sVar5 + 1);
  }
  if (cVar2 == '\x02') {
    if (buf_local._4_4_ == 0) {
      buffer<char>::try_resize(pbStack_30,(ulong)local_68);
      specs_local.precision = 0;
    }
    else {
      uVar8 = (ulong)local_68;
      pcVar9 = pcVar7 + uVar8;
      do {
        pcStack_80 = pcVar9;
        pcVar9 = pcStack_80 + -1;
        bVar3 = snprintf_float<double>::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&end_1 + 7),*pcVar9);
      } while (bVar3);
      value_00 = ((int)(pcVar7 + uVar8) - (int)pcVar9) + -1;
      tVar4 = to_unsigned<int>(value_00);
      memmove(pcVar9,pcStack_80,(ulong)tVar4);
      buffer<char>::try_resize(pbStack_30,(ulong)(local_68 - 1));
      specs_local.precision = -value_00;
    }
  }
  else if (cVar2 == '\x03') {
    buffer<char>::try_resize(pbStack_30,local_68 + sVar5);
    specs_local.precision = 0;
  }
  else {
    uVar8 = (ulong)local_68;
    pcVar9 = pcVar7 + uVar8;
    do {
      _exp = pcVar9;
      pcVar9 = _exp + -1;
    } while (*pcVar9 != 'e');
    cVar2 = *_exp;
    if (cVar2 != '+' && cVar2 != '-') {
      __assert_fail("sign == \'+\' || sign == \'-\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                    ,0x4cc,
                    "int fmt::detail::snprintf_float(T, int, float_specs, buffer<char> &) [T = double]"
                   );
    }
    p._0_4_ = 0;
    pcStack_a8 = _exp + 1;
    do {
      bVar3 = snprintf_float<double>::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&end_1 + 7),*pcStack_a8);
      if (!bVar3) {
        __assert_fail("is_digit(*p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                      ,0x4d0,
                      "int fmt::detail::snprintf_float(T, int, float_specs, buffer<char> &) [T = double]"
                     );
      }
      pcVar11 = pcStack_a8 + 1;
      p._0_4_ = (int)p * 10 + *pcStack_a8 + -0x30;
      pcStack_a8 = pcVar11;
    } while (pcVar11 != pcVar7 + uVar8);
    if (cVar2 == '-') {
      p._0_4_ = -(int)p;
    }
    fraction_end._4_4_ = 0;
    if (pcVar9 != pcVar7 + 1) {
      for (local_b8 = _exp + -2; *local_b8 == '0'; local_b8 = local_b8 + -1) {
      }
      fraction_end._4_4_ = ((int)local_b8 - (int)pcVar7) + -1;
      tVar4 = to_unsigned<int>(fraction_end._4_4_);
      memmove(pcVar7 + 1,pcVar7 + 2,(ulong)tVar4);
    }
    pbVar1 = pbStack_30;
    tVar4 = to_unsigned<int>(fraction_end._4_4_);
    buffer<char>::try_resize(pbVar1,tVar4 + sVar5 + 1);
    specs_local.precision = (int)p - fraction_end._4_4_;
  }
  return specs_local.precision;
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>::value, "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // The longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint && specs.format == float_format::hex) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FMT_FUZZ
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.try_resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, to_unsigned(fraction_size));
      buf.try_resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.try_resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    assert(sign == '+' || sign == '-');
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      assert(is_digit(*p));
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, to_unsigned(fraction_size));
    }
    buf.try_resize(to_unsigned(fraction_size) + offset + 1);
    return exp - fraction_size;
  }
}